

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::invalidateSubFramebuffer
          (ReferenceContext *this,deUint32 target,int numAttachments,deUint32 *attachments,int x,
          int y,int width,int height)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int width_00;
  deBool dVar4;
  int iVar5;
  int iVar6;
  ConstPixelBufferAccess *pCVar7;
  int *piVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  bool bVar12;
  Vector<int,_4> local_170;
  Vector<float,_4> local_160;
  undefined1 local_150 [8];
  MultisamplePixelBufferAccess access;
  Vector<int,_4> local_118;
  undefined1 local_108 [8];
  IVec4 area;
  MultisamplePixelBufferAccess local_d0;
  MultisamplePixelBufferAccess local_a8;
  undefined1 local_80 [8];
  MultisamplePixelBufferAccess buf;
  int local_50;
  bool isStencil_1;
  bool isDepth_1;
  bool isColor_1;
  int ndx;
  bool isDepthStencil;
  bool isStencil;
  bool isDepth;
  bool isColor;
  int attNdx;
  bool discardBuffers [3];
  bool isFboBound;
  int stencilClearValue;
  float depthClearValue;
  Vec4 colorClearValue;
  int y_local;
  int x_local;
  deUint32 *attachments_local;
  int numAttachments_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  colorClearValue.m_data[2] = (float)y;
  colorClearValue.m_data[3] = (float)x;
  do {
    if (target != 0x8d40) {
      setError(this,0x500);
      return;
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  while ((-1 < numAttachments && ((numAttachments < 2 || (attachments != (deUint32 *)0x0))))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      do {
        if ((width < 0) || (height < 0)) {
          setError(this,0x501);
          return;
        }
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stencilClearValue,0.0);
      _discardBuffers = 0x3f800000;
      attNdx = 0;
      isColor = this->m_drawFramebufferBinding != (Framebuffer *)0x0;
      memset(&isDepthStencil,0,3);
      ndx = 0;
      do {
        if (numAttachments <= ndx) {
          for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
            if (((&isDepthStencil)[local_50] & 1U) != 0) {
              buf.m_access.super_ConstPixelBufferAccess.m_data._7_1_ = local_50 == 0;
              buf.m_access.super_ConstPixelBufferAccess.m_data._6_1_ = local_50 == 1;
              buf.m_access.super_ConstPixelBufferAccess.m_data._5_1_ = local_50 == 2;
              if ((bool)buf.m_access.super_ConstPixelBufferAccess.m_data._7_1_) {
                getDrawColorbuffer((MultisamplePixelBufferAccess *)local_80,this);
              }
              else if ((bool)buf.m_access.super_ConstPixelBufferAccess.m_data._6_1_) {
                getDrawDepthbuffer(&local_a8,this);
                getDepthMultisampleAccess((MultisamplePixelBufferAccess *)local_80,&local_a8);
              }
              else {
                getDrawStencilbuffer(&local_d0,this);
                getStencilMultisampleAccess((MultisamplePixelBufferAccess *)local_80,&local_d0);
              }
              rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                        ((MultisampleConstPixelBufferAccess *)(area.m_data + 2),
                         (MultisamplePixelBufferAccess *)local_80);
              bVar12 = isEmpty((MultisampleConstPixelBufferAccess *)(area.m_data + 2));
              if (!bVar12) {
                pCVar7 = &rr::MultisamplePixelBufferAccess::raw
                                    ((MultisamplePixelBufferAccess *)local_80)->
                          super_ConstPixelBufferAccess;
                iVar5 = tcu::ConstPixelBufferAccess::getHeight(pCVar7);
                pCVar7 = &rr::MultisamplePixelBufferAccess::raw
                                    ((MultisamplePixelBufferAccess *)local_80)->
                          super_ConstPixelBufferAccess;
                iVar6 = tcu::ConstPixelBufferAccess::getDepth(pCVar7);
                tcu::Vector<int,_4>::Vector(&local_118,0,0,iVar5,iVar6);
                tcu::Vector<int,_4>::Vector
                          ((Vector<int,_4> *)&access.m_access.super_ConstPixelBufferAccess.m_data,
                           (int)colorClearValue.m_data[3],(int)colorClearValue.m_data[2],width,
                           height);
                intersect((sglr *)local_108,&local_118,
                          (IVec4 *)&access.m_access.super_ConstPixelBufferAccess.m_data);
                piVar8 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_108);
                iVar5 = *piVar8;
                piVar8 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_108);
                iVar6 = *piVar8;
                piVar8 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_108);
                width_00 = *piVar8;
                piVar8 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_108);
                rr::getSubregion((MultisamplePixelBufferAccess *)local_150,
                                 (MultisamplePixelBufferAccess *)local_80,iVar5,iVar6,width_00,
                                 *piVar8);
                if ((buf.m_access.super_ConstPixelBufferAccess.m_data._7_1_ & 1) == 0) {
                  if ((buf.m_access.super_ConstPixelBufferAccess.m_data._6_1_ & 1) == 0) {
                    if ((buf.m_access.super_ConstPixelBufferAccess.m_data._5_1_ & 1) != 0) {
                      tcu::Vector<int,_4>::Vector(&local_170,0);
                      rr::clear((MultisamplePixelBufferAccess *)local_150,&local_170);
                    }
                  }
                  else {
                    tcu::Vector<float,_4>::Vector(&local_160,1.0);
                    rr::clear((MultisamplePixelBufferAccess *)local_150,&local_160);
                  }
                }
                else {
                  rr::clear((MultisamplePixelBufferAccess *)local_150,(Vec4 *)&stencilClearValue);
                }
              }
            }
          }
          return;
        }
        dVar1 = attachments[ndx];
        dVar9 = 0x1800;
        if ((isColor & 1U) != 0) {
          dVar9 = 0x8ce0;
        }
        dVar2 = attachments[ndx];
        dVar10 = 0x1801;
        if ((isColor & 1U) != 0) {
          dVar10 = 0x8d00;
        }
        dVar3 = attachments[ndx];
        dVar11 = 0x1802;
        if ((isColor & 1U) != 0) {
          dVar11 = 0x8d20;
        }
        bVar12 = false;
        if ((isColor & 1U) != 0) {
          bVar12 = attachments[ndx] == 0x821a;
        }
        do {
          if ((((dVar1 != dVar9) && (dVar2 != dVar10)) && (dVar3 != dVar11)) && (!bVar12)) {
            setError(this,0x501);
            return;
          }
          dVar4 = ::deGetFalse();
        } while (dVar4 != 0);
        if (dVar1 == dVar9) {
          isDepthStencil = true;
        }
        if ((dVar2 == dVar10) || (bVar12)) {
          isStencil = true;
        }
        if ((dVar3 == dVar11) || (bVar12)) {
          isDepth = true;
        }
        ndx = ndx + 1;
      } while( true );
    }
  }
  setError(this,0x501);
  return;
}

Assistant:

void ReferenceContext::invalidateSubFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments, int x, int y, int width, int height)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((numAttachments < 0) || (numAttachments > 1 && attachments == DE_NULL), GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// \todo [2012-07-17 pyry] Support multiple color attachments.

	const Vec4		colorClearValue		(0.0f);
	const float		depthClearValue		= 1.0f;
	const int		stencilClearValue	= 0;

	bool			isFboBound			= m_drawFramebufferBinding != DE_NULL;
	bool			discardBuffers[3]	= { false, false, false }; // Color, depth, stencil

	for (int attNdx = 0; attNdx < numAttachments; attNdx++)
	{
		bool	isColor			= attachments[attNdx] == (isFboBound ? GL_COLOR_ATTACHMENT0		: GL_COLOR);
		bool	isDepth			= attachments[attNdx] == (isFboBound ? GL_DEPTH_ATTACHMENT		: GL_DEPTH);
		bool	isStencil		= attachments[attNdx] == (isFboBound ? GL_STENCIL_ATTACHMENT	: GL_STENCIL);
		bool	isDepthStencil	= isFboBound && attachments[attNdx] == GL_DEPTH_STENCIL_ATTACHMENT;

		RC_IF_ERROR(!isColor && !isDepth && !isStencil && !isDepthStencil, GL_INVALID_VALUE, RC_RET_VOID);

		if (isColor)						discardBuffers[0] = true;
		if (isDepth || isDepthStencil)		discardBuffers[1] = true;
		if (isStencil || isDepthStencil)	discardBuffers[2] = true;
	}

	for (int ndx = 0; ndx < 3; ndx++)
	{
		if (!discardBuffers[ndx])
			continue;

		bool								isColor					= ndx == 0;
		bool								isDepth					= ndx == 1;
		bool								isStencil				= ndx == 2;
		rr::MultisamplePixelBufferAccess	buf						= isColor ? getDrawColorbuffer()								:
																	  isDepth ? getDepthMultisampleAccess(getDrawDepthbuffer())		:
																				getStencilMultisampleAccess(getDrawStencilbuffer());

		if (isEmpty(buf))
			continue;

		tcu::IVec4							area					= intersect(tcu::IVec4(0, 0, buf.raw().getHeight(), buf.raw().getDepth()), tcu::IVec4(x, y, width, height));
		rr::MultisamplePixelBufferAccess	access					= rr::getSubregion(buf, area.x(), area.y(), area.z(), area.w());

		if (isColor)
			rr::clear(access, colorClearValue);
		else if (isDepth)
			rr::clear(access, tcu::Vec4(depthClearValue));
		else if (isStencil)
			rr::clear(access, tcu::IVec4(stencilClearValue));
	}
}